

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp_id_tc26_gost_3410_2012_512_paramSetA.c
# Opt level: O1

int point_mul_g_id_tc26_gost_3410_2012_512_paramSetA
              (EC_GROUP *group,EC_POINT *r,BIGNUM *n,BN_CTX *ctx)

{
  ulong uVar1;
  char cVar2;
  int iVar3;
  int iVar4;
  BIGNUM *pBVar5;
  BIGNUM *pBVar6;
  long lVar7;
  long lVar8;
  uint uVar9;
  pt_aff_t_conflict2 (*papVar10) [16];
  pt_aff_t_conflict2 *ppVar11;
  byte bVar12;
  limb_t *plVar13;
  uint64_t *puVar14;
  long lVar15;
  bool bVar16;
  uchar b_n [64];
  uchar b_x [64];
  uchar b_y [64];
  int8_t rnaf [103];
  uint64_t local_3f8 [10];
  uint64_t local_3a8;
  long lStack_3a0;
  long local_398;
  long lStack_390;
  long local_388;
  long lStack_380;
  long local_378;
  long lStack_370;
  long local_368;
  long lStack_360;
  pt_aff_t_conflict2 local_358;
  byte local_2b8 [64];
  undefined1 local_278 [32];
  undefined1 local_258 [16];
  undefined1 local_248 [16];
  undefined1 local_238 [16];
  uint64_t local_228 [10];
  undefined1 local_1d8 [16];
  undefined1 local_1c8 [16];
  undefined1 local_1b8 [16];
  undefined1 local_1a8 [16];
  undefined1 local_198 [16];
  pt_prj_t_conflict2 local_188;
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [15];
  undefined1 uStack_39;
  undefined7 uStack_38;
  
  bVar12 = 0;
  BN_CTX_start((BN_CTX *)ctx);
  pBVar5 = BN_CTX_get((BN_CTX *)ctx);
  pBVar6 = BN_CTX_get((BN_CTX *)ctx);
  iVar4 = 0;
  if ((pBVar6 != (BIGNUM *)0x0) &&
     (iVar3 = BN_bn2lebinpad(n,local_2b8,0x40), iVar4 = 0, iVar3 == 0x40)) {
    local_48 = SUB1615((undefined1  [16])0x0,0);
    local_58 = (undefined1  [16])0x0;
    local_68 = (undefined1  [16])0x0;
    local_78 = (undefined1  [16])0x0;
    local_88 = (undefined1  [16])0x0;
    local_98 = (undefined1  [16])0x0;
    uStack_39 = 0;
    uStack_38 = 0;
    memset(local_278,0,0xf0);
    memset(&local_188,0,0xf0);
    memset(&local_358,0,0xa0);
    scalar_rwnaf(local_98,local_2b8);
    local_238 = (undefined1  [16])0x0;
    local_248 = (undefined1  [16])0x0;
    local_258 = (undefined1  [16])0x0;
    local_278._16_16_ = (undefined1  [16])0x0;
    local_278._0_16_ = (undefined1  [16])0x0;
    plVar13 = const_one;
    puVar14 = local_228;
    for (lVar7 = 10; lVar7 != 0; lVar7 = lVar7 + -1) {
      *puVar14 = *plVar13;
      plVar13 = plVar13 + (ulong)bVar12 * -2 + 1;
      puVar14 = puVar14 + (ulong)bVar12 * -2 + 1;
    }
    local_198 = (undefined1  [16])0x0;
    local_1a8 = (undefined1  [16])0x0;
    local_1b8 = (undefined1  [16])0x0;
    local_1c8 = (undefined1  [16])0x0;
    local_1d8 = (undefined1  [16])0x0;
    puVar14 = local_358.Y;
    lVar7 = 9;
    do {
      if (lVar7 != 9) {
        uVar9 = 0;
        do {
          point_double((pt_prj_t_conflict2 *)local_278,(pt_prj_t_conflict2 *)local_278);
          if (lVar7 == 9) break;
          bVar16 = uVar9 < 4;
          uVar9 = uVar9 + 1;
        } while (bVar16);
      }
      papVar10 = lut_cmb;
      lVar8 = 0;
      do {
        uVar1 = lVar7 + lVar8 * 10;
        if (uVar1 < 0x67) {
          cVar2 = local_98[uVar1];
          lVar15 = 0;
          ppVar11 = *papVar10;
          do {
            bVar16 = (int)((int)(char)(-1 - (cVar2 >> 7)) + ((int)cVar2 >> 0x1f ^ (int)cVar2) >> 1 ^
                          (uint)lVar15) < 1;
            fiat_id_tc26_gost_3410_2012_512_paramSetA_selectznz
                      (local_358.X,bVar16,local_358.X,ppVar11->X);
            fiat_id_tc26_gost_3410_2012_512_paramSetA_selectznz(puVar14,bVar16,puVar14,ppVar11->Y);
            lVar15 = lVar15 + 1;
            ppVar11 = ppVar11 + 1;
          } while (lVar15 != 0x10);
          local_3a8 = 0x1ffffffffffb8e - local_358.Y[0];
          lStack_3a0 = 0xffffffffffffe - local_358.Y[1];
          local_388 = 0xffffffffffffe - local_358.Y[4];
          lStack_380 = 0x1ffffffffffffe - local_358.Y[5];
          local_398 = 0xffffffffffffe - local_358.Y[2];
          lStack_390 = 0xffffffffffffe - local_358.Y[3];
          local_378 = 0xffffffffffffe - local_358.Y[6];
          lStack_370 = 0xffffffffffffe - local_358.Y[7];
          local_368 = 0xffffffffffffe - local_358.Y[8];
          lStack_360 = 0xffffffffffffe - local_358.Y[9];
          fiat_id_tc26_gost_3410_2012_512_paramSetA_selectznz
                    (puVar14,(byte)(cVar2 >> 7) >> 7,puVar14,&local_3a8);
          point_add_mixed((pt_prj_t_conflict2 *)local_278,(pt_prj_t_conflict2 *)local_278,&local_358
                         );
        }
        lVar8 = lVar8 + 1;
        papVar10 = (pt_aff_t_conflict2 (*) [16])((long)papVar10 + 0xa00);
      } while (lVar8 != 0xc);
      bVar16 = lVar7 != 0;
      lVar7 = lVar7 + -1;
    } while (bVar16);
    papVar10 = lut_cmb;
    ppVar11 = &local_358;
    for (lVar7 = 10; lVar7 != 0; lVar7 = lVar7 + -1) {
      ppVar11->X[0] = (*papVar10)[0].X[0];
      papVar10 = (pt_aff_t_conflict2 (*) [16])((long)papVar10 + ((ulong)bVar12 * -2 + 1) * 8);
      ppVar11 = (pt_aff_t_conflict2 *)((long)ppVar11 + (ulong)bVar12 * -0x10 + 8);
    }
    local_358.Y[0] = 0x1a7634adea08ea;
    local_358.Y[1] = 0xa03dca0a47764;
    local_358.Y[2] = 0xb8b7c2cffae02;
    local_358.Y[3] = 0xa45b0a28656bb;
    local_358.Y[4] = 0x9074eca0d817d;
    local_358.Y[5] = 0x1f9b02341056dd;
    local_358.Y[6] = 0xec530e543e886;
    local_358.Y[7] = 0xb575e326343c5;
    local_358.Y[8] = 0xd4716791dfa46;
    local_358.Y[9] = 0xc57e180bc2be3;
    point_add_mixed(&local_188,(pt_prj_t_conflict2 *)local_278,&local_358);
    bVar12 = local_2b8[0] & 1;
    fiat_id_tc26_gost_3410_2012_512_paramSetA_selectznz
              ((uint64_t *)local_278,bVar12,local_188.X,(uint64_t *)local_278);
    fiat_id_tc26_gost_3410_2012_512_paramSetA_selectznz(local_228,bVar12,local_188.Y,local_228);
    fiat_id_tc26_gost_3410_2012_512_paramSetA_selectznz
              ((uint64_t *)local_1d8,bVar12,local_188.Z,(uint64_t *)local_1d8);
    fiat_id_tc26_gost_3410_2012_512_paramSetA_inv((uint64_t *)local_1d8,(uint64_t *)local_1d8);
    fiat_id_tc26_gost_3410_2012_512_paramSetA_carry_mul
              (local_3f8,(uint64_t *)local_278,(uint64_t *)local_1d8);
    fiat_id_tc26_gost_3410_2012_512_paramSetA_carry_mul(&local_3a8,local_228,(uint64_t *)local_1d8);
    fiat_id_tc26_gost_3410_2012_512_paramSetA_to_bytes(local_278,local_3f8);
    fiat_id_tc26_gost_3410_2012_512_paramSetA_to_bytes((uint8_t *)&local_188,&local_3a8);
    iVar4 = CRYPTO_memcmp("",local_278,0x40);
    if ((iVar4 == 0) && (iVar4 = CRYPTO_memcmp("",&local_188,0x40), iVar4 == 0)) {
      iVar4 = EC_POINT_set_to_infinity((EC_GROUP *)group,(EC_POINT *)r);
      if (iVar4 == 0) {
        iVar4 = 0;
        goto LAB_001386db;
      }
    }
    else {
      lVar7 = BN_lebin2bn(local_278,0x40,pBVar5);
      iVar4 = 0;
      if ((lVar7 == 0) ||
         ((lVar7 = BN_lebin2bn(&local_188,0x40,pBVar6), lVar7 == 0 ||
          (iVar3 = EC_POINT_set_affine_coordinates(group,r,pBVar5,pBVar6,ctx), iVar4 = 0, iVar3 == 0
          )))) goto LAB_001386db;
    }
    iVar4 = 1;
  }
LAB_001386db:
  BN_CTX_end((BN_CTX *)ctx);
  return iVar4;
}

Assistant:

int
    point_mul_g_id_tc26_gost_3410_2012_512_paramSetA(const EC_GROUP *group,
                                                     EC_POINT *r,
                                                     const BIGNUM *n,
                                                     BN_CTX *ctx) {
    int ret = 0;
    unsigned char b_x[64];
    unsigned char b_y[64];
    unsigned char b_n[64];
    BIGNUM *x = NULL, *y = NULL;

    BN_CTX_start(ctx);
    x = BN_CTX_get(ctx);
    if ((y = BN_CTX_get(ctx)) == NULL || BN_bn2lebinpad(n, b_n, 64) != 64)
        goto err;
    /* do the fixed scalar multiplication */
    point_mul_g(b_x, b_y, b_n);
    /* check for infinity */
    if (CRYPTO_memcmp(const_zb, b_x, 64) == 0 &&
        CRYPTO_memcmp(const_zb, b_y, 64) == 0) {
        if (!EC_POINT_set_to_infinity(group, r)) goto err;
    } else {
        /* otherwise, pack the bytes into the result */
        if (BN_lebin2bn(b_x, 64, x) == NULL ||
            BN_lebin2bn(b_y, 64, y) == NULL ||
            !EC_POINT_set_affine_coordinates(group, r, x, y, ctx))
            goto err;
    }
    ret = 1;
err:
    BN_CTX_end(ctx);
    return ret;
}